

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::SampleShadingApiCaseGroup::SampleShadingApiCase::iterate(SampleShadingApiCase *this)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  char *description;
  byte bVar6;
  qpTestResult testResult;
  TestContext *this_00;
  int i;
  long lVar7;
  GLfloat result;
  undefined8 uStack_38;
  long lVar5;
  
  uStack_38 = in_RAX;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  if ((this->m_glslVersion != GLSL_VERSION_310_ES) ||
     (bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_sample_shading"),
     bVar1)) {
    this->m_pGLMinSampleShading = *(glMinSampleShadingFunc *)(lVar5 + 0xdc8);
    bVar6 = 1;
    lVar7 = 0;
    do {
      (*this->m_pGLMinSampleShading)((GLfloat)(&DAT_01ae6630)[lVar7 * 2]);
      uStack_38 = CONCAT44(0xbf800000,(undefined4)uStack_38);
      (**(code **)(lVar5 + 0x818))(0x8c37,(long)&uStack_38 + 4);
      bVar6 = bVar6 & uStack_38._4_4_ == (float)(&DAT_01ae6634)[lVar7 * 2];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    (**(code **)(lVar5 + 0x5e0))(0x8c36);
    cVar2 = (**(code **)(lVar5 + 0xc70))(0x8c36);
    (**(code **)(lVar5 + 0x4e8))(0x8c36);
    cVar3 = (**(code **)(lVar5 + 0xc70))(0x8c36);
    (*this->m_pGLMinSampleShading)(0.0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    bVar6 = (cVar3 == '\0' && cVar2 != '\0') & bVar6;
    testResult = (qpTestResult)(bVar6 ^ 1);
    description = "Fail";
    if (bVar6 != 0) {
      description = "Pass";
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "GL_OES_sample_shading";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

SampleShadingApiCaseGroup::SampleShadingApiCase::IterateResult SampleShadingApiCaseGroup::SampleShadingApiCase::
	iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_shading");
		return STOP;
	}

	m_pGLMinSampleShading = gl.minSampleShading;

	struct Test
	{
		GLfloat input;
		GLfloat result;
	} tests[] = {
		{ 0.0f, 0.0f }, { 0.5f, 0.5f }, { -1.0f, 0.0f }, { 2.0f, 1.0f },
	};
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(tests); ++i)
	{
		m_pGLMinSampleShading(tests[i].input);
		GLfloat result = -1.0f;
		gl.getFloatv(GL_MIN_SAMPLE_SHADING_VALUE_OES, &result);
		if (result != tests[i].result)
		{
			isOk = false;
		}
	}

	gl.enable(GL_SAMPLE_SHADING_OES);
	if (!gl.isEnabled(GL_SAMPLE_SHADING_OES))
	{
		isOk = false;
	}
	gl.disable(GL_SAMPLE_SHADING_OES);
	if (gl.isEnabled(GL_SAMPLE_SHADING_OES))
	{
		isOk = false;
	}

	m_pGLMinSampleShading(0.0f);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}